

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O3

void __thiscall TApp_BuiltinComplexFail_Test::TestBody(TApp_BuiltinComplexFail_Test *this)

{
  bool bVar1;
  long lVar2;
  AssertHelper local_e0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  string local_98;
  string local_78;
  string local_58;
  complex<double> local_38;
  
  local_38._M_value._0_4_ = 0;
  local_38._M_value._4_4_ = 0x3ff00000;
  local_38._M_value._8_4_ = 0;
  local_38._M_value._12_4_ = 0x40000000;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-c,--complex","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"COMPLEX","");
  CLI::App::add_complex<std::complex<double>>
            (&(this->super_TApp).app,&local_58,&local_38,&local_78,false,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_d8[0].ptr_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-c","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"4","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_d8,&local_98);
  lVar2 = 0;
  do {
    if (local_a8 + lVar2 != *(undefined1 **)((long)local_b8 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_b8 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_d8);
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
             ,0x62,
             "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if (local_d8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_d8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8[0].ptr_ + 8))();
    }
  }
  return;
}

Assistant:

TEST_F(TApp, BuiltinComplexFail) {
    cx comp{1, 2};
    app.add_complex("-c,--complex", comp);

    args = {"-c", "4"};

    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}